

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_buffer__adjust_quic_blocksize(ptls_buffer_t *buf,size_t body_size)

{
  sbyte sVar1;
  int iVar2;
  byte bVar3;
  uint8_t *puVar4;
  size_t sVar5;
  size_t __n;
  uint8_t sizebuf [8];
  
  puVar4 = sizebuf;
  if (0x3f < body_size) {
    if (body_size < 0x4000) {
      sizebuf[0] = (byte)(body_size >> 8) | 0x40;
      puVar4 = sizebuf + 1;
    }
    else {
      if (body_size < 0x40000000) {
        iVar2 = 0x10;
        bVar3 = 0x80;
        sVar1 = 0x18;
      }
      else {
        if (body_size >> 0x3e != 0) {
          __assert_fail("v <= 4611686018427387903",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/include/picotls.h"
                        ,0x5ab,"uint8_t *ptls_encode_quicint(uint8_t *, uint64_t)");
        }
        iVar2 = 0x30;
        bVar3 = 0xc0;
        sVar1 = 0x38;
      }
      sizebuf[0] = (byte)(body_size >> sVar1) | bVar3;
      puVar4 = sizebuf + 1;
      do {
        *puVar4 = (uint8_t)(body_size >> ((byte)iVar2 & 0x3f));
        puVar4 = puVar4 + 1;
        iVar2 = iVar2 + -8;
      } while (iVar2 != 0);
    }
  }
  *puVar4 = (uint8_t)body_size;
  sVar5 = (long)puVar4 - (long)sizebuf;
  __n = sVar5 + 1;
  if (__n == 1) {
    sVar5 = buf->off;
  }
  else {
    iVar2 = ptls_buffer_reserve(buf,sVar5);
    if (iVar2 != 0) {
      return iVar2;
    }
    memmove(buf->base + (buf->off - body_size) + sVar5,buf->base + (buf->off - body_size),body_size)
    ;
    sVar5 = sVar5 + buf->off;
    buf->off = sVar5;
  }
  memcpy(buf->base + ((sVar5 - body_size) - __n),sizebuf,__n);
  return 0;
}

Assistant:

int ptls_buffer__adjust_quic_blocksize(ptls_buffer_t *buf, size_t body_size)
{
    uint8_t sizebuf[PTLS_ENCODE_QUICINT_CAPACITY];
    size_t sizelen = ptls_encode_quicint(sizebuf, body_size) - sizebuf;

    /* adjust amount of space before body_size to `sizelen` bytes */
    if (sizelen != 1) {
        int ret;
        if ((ret = ptls_buffer_reserve(buf, sizelen - 1)) != 0)
            return ret;
        memmove(buf->base + buf->off - body_size - 1 + sizelen, buf->base + buf->off - body_size, body_size);
        buf->off += sizelen - 1;
    }

    /* write the size */
    memcpy(buf->base + buf->off - body_size - sizelen, sizebuf, sizelen);

    return 0;
}